

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void drft_init(drft_lookup *l,int n)

{
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  float *pfVar16;
  double dVar17;
  double dVar18;
  int local_80;
  float local_7c;
  
  uVar5 = (ulong)(uint)n;
  l->n = n;
  pfVar3 = (float *)calloc((long)(n * 3),4);
  l->trigcache = pfVar3;
  piVar4 = (int *)calloc(0x20,4);
  l->splitcache = piVar4;
  if (n == 1) {
    return;
  }
  iVar6 = 0;
  uVar13 = 0;
  lVar7 = -1;
  do {
    lVar12 = lVar7 + 1;
    if (lVar7 < 3) {
      iVar6 = *(int *)(drfti1_ntryh + lVar12 * 4);
    }
    else {
      iVar6 = iVar6 + 2;
    }
    piVar9 = piVar4 + (long)(int)uVar13 + 2;
    uVar1 = (long)(int)uVar13;
    while( true ) {
      uVar13 = uVar1;
      uVar14 = 0;
      if (0 < (int)uVar13) {
        uVar14 = uVar13 & 0xffffffff;
      }
      uVar1 = (long)(int)uVar5 / (long)iVar6;
      iVar2 = (int)uVar1;
      lVar7 = lVar12;
      if ((int)uVar5 != iVar2 * iVar6) break;
      piVar4[uVar13 + 2] = iVar6;
      if (uVar13 != 0 && iVar6 == 2) {
        for (lVar7 = 0; -lVar7 != uVar14; lVar7 = lVar7 + -1) {
          piVar9[lVar7] = piVar9[lVar7 + -1];
        }
        piVar4[2] = 2;
      }
      piVar9 = piVar9 + 1;
      uVar5 = uVar1 & 0xffffffff;
      uVar1 = uVar13 + 1;
      if (iVar2 == 1) {
        *piVar4 = n;
        piVar4[1] = (int)(uVar13 + 1);
        if (uVar13 == 0) {
          return;
        }
        iVar6 = 0;
        local_80 = 1;
        for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
          iVar2 = piVar4[uVar5 + 2];
          iVar11 = iVar2 * local_80;
          iVar10 = n / iVar11;
          if (iVar2 < 2) {
            iVar2 = 1;
          }
          pfVar16 = pfVar3 + (long)n + (long)iVar6;
          iVar8 = 0;
          for (iVar15 = 0; iVar15 != iVar2 + -1; iVar15 = iVar15 + 1) {
            iVar8 = iVar8 + local_80;
            local_7c = 0.0;
            for (lVar7 = 1; (int)lVar7 + 1 < iVar10; lVar7 = lVar7 + 2) {
              local_7c = local_7c + 1.0;
              dVar17 = (double)((float)iVar8 * (6.2831855 / (float)n) * local_7c);
              dVar18 = cos(dVar17);
              pfVar16[lVar7 + -1] = (float)dVar18;
              dVar17 = sin(dVar17);
              pfVar16[lVar7] = (float)dVar17;
            }
            pfVar16 = pfVar16 + iVar10;
          }
          iVar6 = iVar6 + (iVar2 + -1) * iVar10;
          local_80 = iVar11;
        }
        return;
      }
    }
  } while( true );
}

Assistant:

void drft_init(drft_lookup *l,int n){
  l->n=n;
  l->trigcache=_ogg_calloc(3*n,sizeof(*l->trigcache));
  l->splitcache=_ogg_calloc(32,sizeof(*l->splitcache));
  fdrffti(n, l->trigcache, l->splitcache);
}